

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_sampler.cc
# Opt level: O0

ostream * quic::operator<<(ostream *os,SendTimeState *s)

{
  ostream *poVar1;
  SendTimeState *s_local;
  ostream *os_local;
  
  poVar1 = std::operator<<(os,"{valid:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(s->is_valid & 1));
  poVar1 = std::operator<<(poVar1,", app_limited:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(bool)(s->is_app_limited & 1));
  poVar1 = std::operator<<(poVar1,", total_sent:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,s->total_bytes_sent);
  poVar1 = std::operator<<(poVar1,", total_acked:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,s->total_bytes_acked);
  poVar1 = std::operator<<(poVar1,", total_lost:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,s->total_bytes_lost);
  poVar1 = std::operator<<(poVar1,", inflight:");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,s->bytes_in_flight);
  std::operator<<(poVar1,"}");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const SendTimeState& s) {
  os << "{valid:" << s.is_valid << ", app_limited:" << s.is_app_limited
     << ", total_sent:" << s.total_bytes_sent
     << ", total_acked:" << s.total_bytes_acked
     << ", total_lost:" << s.total_bytes_lost
     << ", inflight:" << s.bytes_in_flight << "}";
  return os;
}